

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

bool __thiscall flatbuffers::JavaGRPCGenerator::generate(JavaGRPCGenerator *this)

{
  Namespace *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  const_reference ppSVar4;
  pointer file_00;
  char *name;
  Parameters *in_R8;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string filename;
  string output;
  string local_c0;
  string local_a0;
  value_type local_80;
  Definition *def;
  undefined1 local_68 [8];
  unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
  service;
  undefined1 local_58 [4];
  int i;
  Parameters p;
  FlatBufFile file;
  JavaGRPCGenerator *this_local;
  
  FlatBufFile::FlatBufFile
            ((FlatBufFile *)((long)&p.package_name.field_2 + 8),(this->super_BaseGenerator).parser_,
             (this->super_BaseGenerator).file_name_,kLanguageJava);
  grpc_java_generator::Parameters::Parameters((Parameters *)local_58);
  for (service._M_t.
       super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
       .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ = 0;
      iVar1 = service._M_t.
              super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
              .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_,
      iVar3 = FlatBufFile::service_count((FlatBufFile *)((long)&p.package_name.field_2 + 8)),
      iVar1 < iVar3;
      service._M_t.
      super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
      .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ =
           service._M_t.
           super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
           .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>._M_head_impl._4_4_ + 1) {
    FlatBufFile::service((FlatBufFile *)local_68,(int)&p + 0x18);
    ppSVar4 = std::vector<flatbuffers::ServiceDef_*,_std::allocator<flatbuffers::ServiceDef_*>_>::
              operator[](&(((this->super_BaseGenerator).parser_)->services_).vec,
                         (long)service._M_t.
                               super___uniq_ptr_impl<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_const_grpc_generator::Service_*,_std::default_delete<const_grpc_generator::Service>_>
                               .super__Head_base<0UL,_const_grpc_generator::Service_*,_false>.
                               _M_head_impl._4_4_);
    local_80 = *ppSVar4;
    this_00 = (local_80->super_Definition).defined_namespace;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"",(allocator<char> *)(output.field_2._M_local_buf + 0xf));
    Namespace::GetFullyQualifiedName(&local_a0,this_00,&local_c0,1000);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
    file_00 = std::
              unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
              ::get((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                     *)local_68);
    grpc_java_generator::GenerateServiceSource_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),
               (grpc_java_generator *)(p.package_name.field_2._M_local_buf + 8),(File *)file_00,
               (Service *)local_58,in_R8);
    BaseGenerator::NamespaceDir_abi_cxx11_
              (&local_148,&this->super_BaseGenerator,(local_80->super_Definition).defined_namespace,
               false);
    std::operator+(&local_128,&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_128,"Grpc.java");
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    name = (char *)std::__cxx11::string::c_str();
    bVar2 = SaveFile(name,(string *)((long)&filename.field_2 + 8),false);
    if (!bVar2) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
    std::
    unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>::
    ~unique_ptr((unique_ptr<const_grpc_generator::Service,_std::default_delete<const_grpc_generator::Service>_>
                 *)local_68);
    if (!bVar2) goto LAB_003574ea;
  }
  this_local._7_1_ = 1;
LAB_003574ea:
  grpc_java_generator::Parameters::~Parameters((Parameters *)local_58);
  FlatBufFile::~FlatBufFile((FlatBufFile *)((long)&p.package_name.field_2 + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool generate() {
    FlatBufFile file(parser_, file_name_, FlatBufFile::kLanguageJava);
    grpc_java_generator::Parameters p;
    for (int i = 0; i < file.service_count(); i++) {
      auto service = file.service(i);
      const Definition *def = parser_.services_.vec[i];
      p.package_name =
          def->defined_namespace->GetFullyQualifiedName("");  // file.package();
      std::string output =
          grpc_java_generator::GenerateServiceSource(&file, service.get(), &p);
      std::string filename =
          NamespaceDir(*def->defined_namespace) + def->name + "Grpc.java";
      if (!flatbuffers::SaveFile(filename.c_str(), output, false)) return false;
    }
    return true;
  }